

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O3

void CCEXP::AddVal<short>(CCEXP *obj,char *matname,short val)

{
  int iVar1;
  size_t sVar2;
  uint line;
  char *msg;
  
  obj->ErrorId = 0;
  sVar2 = CCEXP::getTableIndexByName(obj,matname);
  if (sVar2 == 0xffffffffffffffff) {
    msg = "[%s]: AddVal():: Failed to find table with name [%s]!";
    line = 0x2b5;
  }
  else {
    obj->ErrorId = 0;
    if (obj->isActive != true) {
      return;
    }
    if (obj->Status == 1) {
      obj->Status = 2;
      if (sVar2 < (obj->M).elements) {
        iVar1 = CCEXPMat<short>::AddValue
                          ((CCEXPMat<short> *)
                           (obj->M).pdata[sVar2].
                           super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           val);
        obj->Status = 1;
        if (iVar1 == 0) {
          return;
        }
        msg = "[%s]: AddVal():: Internal error occured during AddVal()";
        line = 0x2aa;
      }
      else {
        obj->Status = 1;
        msg = "[%s]: AddVal():: Failed to find table with ID [%zu]!";
        line = 0x2ae;
      }
    }
    else {
      msg = "[%s]: AddVal():: CCEXP object has wrong status.";
      line = 0x2a4;
    }
  }
  CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",line,msg,obj->SavingFile);
  return;
}

Assistant:

void AddVal(
	CCEXP &obj, const char* matname, T val
) {
	obj.ErrorId = 0;
	size_t sel = obj.getTableIndexByName(matname);
	CECS_ERR(CCEXPECS,sel == MAXSIZE_T,"[%s]: AddVal():: Failed to find table with name [%s]!", obj.SavingFile, matname);
	AddVal(obj, sel, val);
}